

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLCheck.cpp
# Opt level: O0

void sf::priv::glCheckError(char *file,uint line,char *expression)

{
  ostream *poVar1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [8];
  string description;
  string local_80 [8];
  string error;
  allocator<char> local_49;
  string local_48 [8];
  string fileString;
  GLenum errorCode;
  char *expression_local;
  uint line_local;
  char *file_local;
  
  fileString.field_2._12_4_ = glGetError();
  if (fileString.field_2._12_4_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,file,&local_49);
    std::allocator<char>::~allocator(&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"Unknown error",(allocator<char> *)(description.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(description.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"No description",&local_a9);
    std::allocator<char>::~allocator(&local_a9);
    switch(fileString.field_2._12_4_) {
    case 0x500:
      std::__cxx11::string::operator=(local_80,"GL_INVALID_ENUM");
      std::__cxx11::string::operator=
                (local_a8,"An unacceptable value has been specified for an enumerated argument.");
      break;
    case 0x501:
      std::__cxx11::string::operator=(local_80,"GL_INVALID_VALUE");
      std::__cxx11::string::operator=(local_a8,"A numeric argument is out of range.");
      break;
    case 0x502:
      std::__cxx11::string::operator=(local_80,"GL_INVALID_OPERATION");
      std::__cxx11::string::operator=
                (local_a8,"The specified operation is not allowed in the current state.");
      break;
    case 0x503:
      std::__cxx11::string::operator=(local_80,"GL_STACK_OVERFLOW");
      std::__cxx11::string::operator=(local_a8,"This command would cause a stack overflow.");
      break;
    case 0x504:
      std::__cxx11::string::operator=(local_80,"GL_STACK_UNDERFLOW");
      std::__cxx11::string::operator=(local_a8,"This command would cause a stack underflow.");
      break;
    case 0x505:
      std::__cxx11::string::operator=(local_80,"GL_OUT_OF_MEMORY");
      std::__cxx11::string::operator=
                (local_a8,"There is not enough memory left to execute the command.");
      break;
    case 0x506:
      std::__cxx11::string::operator=(local_80,"GL_INVALID_FRAMEBUFFER_OPERATION");
      std::__cxx11::string::operator=
                (local_a8,"The object bound to FRAMEBUFFER_BINDING is not \"framebuffer complete\"."
                );
    }
    poVar1 = err();
    poVar1 = std::operator<<(poVar1,"An internal OpenGL call failed in ");
    std::__cxx11::string::find_last_of((char *)local_48,0x2a5db1);
    std::__cxx11::string::substr((ulong)local_d0,(ulong)local_48);
    poVar1 = std::operator<<(poVar1,local_d0);
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
    poVar1 = std::operator<<(poVar1,").");
    poVar1 = std::operator<<(poVar1,"\nExpression:\n   ");
    poVar1 = std::operator<<(poVar1,expression);
    poVar1 = std::operator<<(poVar1,"\nError description:\n   ");
    poVar1 = std::operator<<(poVar1,local_80);
    poVar1 = std::operator<<(poVar1,"\n   ");
    poVar1 = std::operator<<(poVar1,local_a8);
    poVar1 = std::operator<<(poVar1,"\n");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void glCheckError(const char* file, unsigned int line, const char* expression)
{
    // Get the last error
    GLenum errorCode = glGetError();

    if (errorCode != GL_NO_ERROR)
    {
        std::string fileString = file;
        std::string error = "Unknown error";
        std::string description  = "No description";

        // Decode the error code
        switch (errorCode)
        {
            case GL_INVALID_ENUM:
            {
                error = "GL_INVALID_ENUM";
                description = "An unacceptable value has been specified for an enumerated argument.";
                break;
            }

            case GL_INVALID_VALUE:
            {
                error = "GL_INVALID_VALUE";
                description = "A numeric argument is out of range.";
                break;
            }

            case GL_INVALID_OPERATION:
            {
                error = "GL_INVALID_OPERATION";
                description = "The specified operation is not allowed in the current state.";
                break;
            }

            case GL_STACK_OVERFLOW:
            {
                error = "GL_STACK_OVERFLOW";
                description = "This command would cause a stack overflow.";
                break;
            }

            case GL_STACK_UNDERFLOW:
            {
                error = "GL_STACK_UNDERFLOW";
                description = "This command would cause a stack underflow.";
                break;
            }

            case GL_OUT_OF_MEMORY:
            {
                error = "GL_OUT_OF_MEMORY";
                description = "There is not enough memory left to execute the command.";
                break;
            }

            case GLEXT_GL_INVALID_FRAMEBUFFER_OPERATION:
            {
                error = "GL_INVALID_FRAMEBUFFER_OPERATION";
                description = "The object bound to FRAMEBUFFER_BINDING is not \"framebuffer complete\".";
                break;
            }
        }

        // Log the error
        err() << "An internal OpenGL call failed in "
              << fileString.substr(fileString.find_last_of("\\/") + 1) << "(" << line << ")."
              << "\nExpression:\n   " << expression
              << "\nError description:\n   " << error << "\n   " << description << "\n"
              << std::endl;
    }
}